

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void ldamath::vexpdigammify(vw *all,float *gamma,float underflow_threshold)

{
  v4sf p;
  v4sf x;
  undefined1 auVar1 [16];
  bool bVar2;
  float *pfVar3;
  float *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  double dVar7;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar8 [16];
  v4sf afVar9;
  v4sf x_00;
  v4sf x_01;
  v4sf afVar10;
  v4sf arg_1;
  v4sf arg;
  float *fpend;
  float *fp;
  v4sf sum;
  float extra_sum;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  byte local_d9;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  float *local_b0;
  undefined8 local_a8;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 extraout_XMM0_Db_00;
  
  afVar9 = v4sfl(0.0);
  fVar5 = afVar9[2];
  fVar6 = afVar9[3];
  local_a8 = afVar9._0_8_;
  pfVar3 = in_RSI + *(uint *)(in_RDI + 0x3478);
  local_b0 = in_RSI;
  while( true ) {
    local_d9 = 0;
    if (local_b0 < pfVar3) {
      bVar2 = anon_unknown.dwarf_f87bc::is_aligned16((void *)0x214ebf);
      local_d9 = bVar2 ^ 0xff;
    }
    if ((local_d9 & 1) == 0) break;
    fVar4 = fastdigamma(in_stack_ffffffffffffff14);
    *local_b0 = fVar4;
    local_b0 = local_b0 + 1;
  }
  for (; bVar2 = anon_unknown.dwarf_f87bc::is_aligned16((void *)0x214f17),
      bVar2 && local_b0 + 4 < pfVar3; local_b0 = local_b0 + 4) {
    local_c8 = (float)*(undefined8 *)local_b0;
    fStack_c4 = (float)((ulong)*(undefined8 *)local_b0 >> 0x20);
    local_a8 = CONCAT44(local_a8._4_4_ + fStack_c4,(float)local_a8 + local_c8);
    x[2] = (float)(int)in_stack_ffffffffffffff98;
    x[3] = (float)(int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    x._0_8_ = local_b0;
    afVar9 = vfastdigamma(x);
    fVar5 = afVar9[2];
    fVar6 = afVar9[3];
    *(long *)local_b0 = afVar9._0_8_;
    *(undefined8 *)(local_b0 + 2) = extraout_XMM0_Qb;
  }
  for (; local_b0 < pfVar3; local_b0 = local_b0 + 1) {
    fVar4 = fastdigamma(in_stack_ffffffffffffff14);
    *local_b0 = fVar4;
  }
  afVar9[3] = fVar6;
  afVar9[2] = fVar5;
  afVar9[0] = (float)local_a8;
  afVar9[1] = local_a8._4_4_;
  fVar4 = v4sf_index<0>(afVar9);
  afVar10[3] = fVar6;
  afVar10[2] = fVar5;
  afVar10[0] = (float)local_a8;
  afVar10[1] = local_a8._4_4_;
  fVar5 = v4sf_index<1>(afVar10);
  fVar6 = fVar4 + fVar5;
  x_00[3] = (float)extraout_XMM0_Db;
  x_00[2] = fVar5;
  x_00[0] = (float)local_a8;
  x_00[1] = local_a8._4_4_;
  fVar5 = v4sf_index<2>(x_00);
  x_01[3] = (float)extraout_XMM0_Db_00;
  x_01[2] = fVar5;
  x_01[0] = (float)local_a8;
  x_01[1] = local_a8._4_4_;
  v4sf_index<3>(x_01);
  fVar5 = fastdigamma(in_stack_ffffffffffffff14);
  v4sfl(fVar5);
  local_b0 = in_RSI;
  while( true ) {
    in_stack_ffffffffffffff14 = (float)((uint)in_stack_ffffffffffffff14 & 0xffffff);
    if (local_b0 < pfVar3) {
      bVar2 = anon_unknown.dwarf_f87bc::is_aligned16((void *)0x2150be);
      in_stack_ffffffffffffff14 =
           (float)(CONCAT13(bVar2,SUB43(in_stack_ffffffffffffff14,0)) ^ 0xff000000);
    }
    if (((uint)in_stack_ffffffffffffff14 & 0x1000000) == 0) break;
    in_stack_ffffffffffffff10 = in_XMM0_Da;
    fVar5 = fastexp(0.0);
    dVar7 = std::fmax((double)(ulong)(uint)in_stack_ffffffffffffff10,
                      (double)CONCAT44(extraout_XMM0_Db_01,fVar5));
    *local_b0 = SUB84(dVar7,0);
    local_b0 = local_b0 + 1;
  }
  for (; bVar2 = anon_unknown.dwarf_f87bc::is_aligned16((void *)0x215121),
      bVar2 && local_b0 + 4 < pfVar3; local_b0 = local_b0 + 4) {
    p[1] = in_stack_ffffffffffffff14;
    p[0] = in_stack_ffffffffffffff10;
    p[2] = fVar4;
    p[3] = fVar6;
    afVar9 = vfastexp(p);
    afVar10 = v4sfl(in_XMM0_Da);
    auVar8._8_4_ = (int)extraout_XMM0_Qb_01;
    auVar8._0_8_ = afVar10._0_8_;
    auVar8._12_4_ = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
    auVar1._8_8_ = extraout_XMM0_Qb_00;
    auVar1._0_8_ = afVar9._0_8_;
    auVar8 = maxps(auVar8,auVar1);
    local_d8 = auVar8._0_8_;
    uStack_d0 = auVar8._8_8_;
    *(undefined8 *)local_b0 = local_d8;
    *(undefined8 *)(local_b0 + 2) = uStack_d0;
  }
  for (; local_b0 < pfVar3; local_b0 = local_b0 + 1) {
    fVar5 = fastexp(0.0);
    dVar7 = std::fmax((double)(ulong)(uint)in_XMM0_Da,(double)CONCAT44(extraout_XMM0_Db_02,fVar5));
    *local_b0 = SUB84(dVar7,0);
  }
  return;
}

Assistant:

void vexpdigammify(vw &all, float *gamma, const float underflow_threshold)
{
  float extra_sum = 0.0f;
  v4sf sum = v4sfl(0.0f);
  float *fp;
  const float *fpend = gamma + all.lda;

  // Iterate through the initial part of the array that isn't 128-bit SIMD
  // aligned.
  for (fp = gamma; fp < fpend && !is_aligned16(fp); ++fp)
  {
    extra_sum += *fp;
    *fp = fastdigamma(*fp);
  }

  // Rip through the aligned portion...
  for (; is_aligned16(fp) && fp + 4 < fpend; fp += 4)
  {
    v4sf arg = _mm_load_ps(fp);
    sum = sum + arg;
    arg = vfastdigamma(arg);
    _mm_store_ps(fp, arg);
  }

  for (; fp < fpend; ++fp)
  {
    extra_sum += *fp;
    *fp = fastdigamma(*fp);
  }

#if defined(__SSE3__) || defined(__SSE4_1__)
  // Do two horizontal adds on sum, extract the total from the 0 element:
  sum = _mm_hadd_ps(sum, sum);
  sum = _mm_hadd_ps(sum, sum);
  extra_sum += v4sf_index<0>(sum);
#else
  extra_sum += v4sf_index<0>(sum) + v4sf_index<1>(sum) + v4sf_index<2>(sum) + v4sf_index<3>(sum);
#endif

  extra_sum = fastdigamma(extra_sum);
  sum = v4sfl(extra_sum);

  for (fp = gamma; fp < fpend && !is_aligned16(fp); ++fp)
  {
    *fp = fmax(underflow_threshold, fastexp(*fp - extra_sum));
  }

  for (; is_aligned16(fp) && fp + 4 < fpend; fp += 4)
  {
    v4sf arg = _mm_load_ps(fp);
    arg = arg - sum;
    arg = vfastexp(arg);
    arg = _mm_max_ps(v4sfl(underflow_threshold), arg);
    _mm_store_ps(fp, arg);
  }

  for (; fp < fpend; ++fp)
  {
    *fp = fmax(underflow_threshold, fastexp(*fp - extra_sum));
  }
}